

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O2

void lj_cdata_free(global_State *g,GCcdata *cd)

{
  size_t *psVar1;
  byte bVar2;
  long lVar3;
  uint32_t *puVar4;
  long lVar5;
  size_t sVar6;
  uint32_t uVar7;
  
  bVar2 = cd->marked;
  if ((bVar2 & 0x10) == 0) {
    if ((char)bVar2 < '\0') {
      sVar6 = (size_t)((uint)*(ushort *)((long)&cd[-1].nextgc.gcptr32 + 2) + *(int *)&cd[-1].marked)
      ;
      cd = (GCcdata *)((long)cd - (ulong)(ushort)cd[-1].nextgc.gcptr32);
    }
    else {
      lVar3 = *(long *)(ulong)(g->ctype_state).ptr32;
      lVar5 = (ulong)cd->ctypeid * 0x10;
      if (*(uint *)(lVar3 + lVar5) < 0x60000000) {
        sVar6 = (ulong)*(uint *)(lVar3 + lVar5 + 4) + 8;
      }
      else {
        sVar6 = 0x10;
      }
    }
    (g->gc).total = (g->gc).total - (int)sVar6;
    psVar1 = &(g->gc).freed;
    *psVar1 = *psVar1 + sVar6;
    (*g->allocf)(g->allocd,cd,sVar6,0);
    psVar1 = &(g->gc).cdatanum;
    *psVar1 = *psVar1 - 1;
  }
  else {
    cd->marked = (g->gc).currentwhite & 3 | bVar2 & 0xf0 | 8;
    puVar4 = (uint32_t *)(ulong)(g->gc).mmudata.gcptr32;
    uVar7 = (uint32_t)cd;
    if (puVar4 == (uint32_t *)0x0) {
      (cd->nextgc).gcptr32 = uVar7;
    }
    else {
      (cd->nextgc).gcptr32 = *puVar4;
      *puVar4 = uVar7;
    }
    (g->gc).mmudata.gcptr32 = uVar7;
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_cdata_free(global_State *g, GCcdata *cd)
{
  if (LJ_UNLIKELY(cd->marked & LJ_GC_CDATA_FIN)) {
    GCobj *root;
    makewhite(g, obj2gco(cd));
    markfinalized(obj2gco(cd));
    if ((root = gcref(g->gc.mmudata)) != NULL) {
      setgcrefr(cd->nextgc, root->gch.nextgc);
      setgcref(root->gch.nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    } else {
      setgcref(cd->nextgc, obj2gco(cd));
      setgcref(g->gc.mmudata, obj2gco(cd));
    }
  } else if (LJ_LIKELY(!cdataisv(cd))) {
    CType *ct = ctype_raw(ctype_ctsG(g), cd->ctypeid);
    CTSize sz = ctype_hassize(ct->info) ? ct->size : CTSIZE_PTR;
    lj_assertG(ctype_hassize(ct->info) || ctype_isfunc(ct->info) ||
	       ctype_isextern(ct->info), "free of ctype without a size");
    lj_mem_free(g, cd, sizeof(GCcdata) + sz);
    g->gc.cdatanum--;
  } else {
    lj_mem_free(g, memcdatav(cd), sizecdatav(cd));
    g->gc.cdatanum--;
  }
}